

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O0

void multiply(features *f_dest,features *f_src2,interact *in)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ostream *poVar8;
  float *pfVar9;
  long in_RDX;
  v_array<float> *in_RSI;
  undefined8 in_RDI;
  bool bVar10;
  float fVar11;
  uint64_t cur_id2;
  uint64_t cur_id1;
  size_t i2;
  size_t i1;
  uint64_t prev_id2;
  uint64_t prev_id1;
  uint64_t base_id2;
  uint64_t base_id1;
  uint64_t weight_mask;
  vw *all;
  features *f_src1;
  parameters *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  float fVar12;
  undefined8 in_stack_ffffffffffffff58;
  feature_value fVar13;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  
  fVar13 = (feature_value)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  features::clear((features *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  uVar3 = parameters::mask(in_stack_ffffffffffffff48);
  puVar4 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDX + 0x28),0);
  uVar1 = *puVar4;
  puVar4 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RSI + 1),0);
  uVar2 = *puVar4;
  v_array<float>::operator[]((v_array<float> *)(in_RDX + 8),0);
  v_array<float>::operator[](in_RSI,0);
  v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDX + 0x28),0);
  features::push_back((features *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      fVar13,CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_48 = 0;
  local_50 = 0;
  local_58 = 1;
  local_60 = 1;
  while( true ) {
    sVar5 = features::size((features *)0x2dcb49);
    bVar10 = false;
    if (local_58 < sVar5) {
      sVar5 = features::size((features *)0x2dcb73);
      bVar10 = local_60 < sVar5;
    }
    if (!bVar10) {
      return;
    }
    puVar4 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDX + 0x28),local_58);
    uVar6 = (*puVar4 & uVar3) - (uVar1 & uVar3) & uVar3;
    puVar4 = v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RSI + 1),local_60);
    uVar7 = (*puVar4 & uVar3) - (uVar2 & uVar3) & uVar3;
    if (uVar6 < local_48) {
      poVar8 = std::operator<<((ostream *)&std::cout,"interact features are out of order: ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
      poVar8 = std::operator<<(poVar8," < ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_48);
      poVar8 = std::operator<<(poVar8,". Skipping features.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      return;
    }
    if (uVar7 < local_50) break;
    local_50 = uVar7;
    local_48 = uVar6;
    if (uVar6 == uVar7) {
      fVar13 = (feature_value)((ulong)in_RDI >> 0x20);
      pfVar9 = v_array<float>::operator[]((v_array<float> *)(in_RDX + 8),local_58);
      fVar12 = *pfVar9;
      pfVar9 = v_array<float>::operator[](in_RSI,local_60);
      fVar11 = fVar12 * *pfVar9;
      v_array<unsigned_long>::operator[]((v_array<unsigned_long> *)(in_RDX + 0x28),local_58);
      features::push_back((features *)CONCAT44(fVar11,in_stack_ffffffffffffff60),fVar13,
                          CONCAT44(fVar12,in_stack_ffffffffffffff50));
      local_58 = local_58 + 1;
      local_60 = local_60 + 1;
    }
    else if (uVar6 < uVar7) {
      local_58 = local_58 + 1;
    }
    else {
      local_60 = local_60 + 1;
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"interact features are out of order: ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar7);
  poVar8 = std::operator<<(poVar8," < ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_50);
  poVar8 = std::operator<<(poVar8,". Skipping features.");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void multiply(features& f_dest, features& f_src2, interact& in)
{
  f_dest.clear();
  features& f_src1 = in.feat_store;
  vw* all = in.all;
  uint64_t weight_mask = all->weights.mask();
  uint64_t base_id1 = f_src1.indicies[0] & weight_mask;
  uint64_t base_id2 = f_src2.indicies[0] & weight_mask;

  f_dest.push_back(f_src1.values[0] * f_src2.values[0], f_src1.indicies[0]);

  uint64_t prev_id1 = 0;
  uint64_t prev_id2 = 0;

  for (size_t i1 = 1, i2 = 1; i1 < f_src1.size() && i2 < f_src2.size();)
  {
    // calculating the relative offset from the namespace offset used to match features
    uint64_t cur_id1 = (uint64_t)(((f_src1.indicies[i1] & weight_mask) - base_id1) & weight_mask);
    uint64_t cur_id2 = (uint64_t)(((f_src2.indicies[i2] & weight_mask) - base_id2) & weight_mask);

    // checking for sorting requirement
    if (cur_id1 < prev_id1)
    {
      cout << "interact features are out of order: " << cur_id1 << " < " << prev_id1 << ". Skipping features." << endl;
      return;
    }

    if (cur_id2 < prev_id2)
    {
      cout << "interact features are out of order: " << cur_id2 << " < " << prev_id2 << ". Skipping features." << endl;
      return;
    }

    if (cur_id1 == cur_id2)
    {
      f_dest.push_back(f_src1.values[i1] * f_src2.values[i2], f_src1.indicies[i1]);
      i1++;
      i2++;
    }
    else if (cur_id1 < cur_id2)
      i1++;
    else
      i2++;
    prev_id1 = cur_id1;
    prev_id2 = cur_id2;
  }
}